

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O1

Worker * lace_steal(WorkerP *self,Task *__dq_head,Worker *victim)

{
  TailSplit TVar1;
  Task *pTVar2;
  Worker *in_RAX;
  TailSplit TVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((victim != (Worker *)0x0) && (victim->allstolen == '\0')) {
    TVar1 = (TailSplit)(victim->ts).v.super___atomic_base<unsigned_long>._M_i;
    uVar4 = TVar1._0_4_;
    if (uVar4 < TVar1._4_4_) {
      LOCK();
      TVar3 = victim->ts;
      bVar6 = TVar1 == TVar3;
      if (bVar6) {
        victim->ts = (TailSplit)((ulong)(uVar4 + 1) | (ulong)TVar1 & 0xffffffff00000000);
        TVar3 = TVar1;
      }
      UNLOCK();
      in_RAX = (Worker *)0x1;
      if (bVar6) {
        pTVar2 = victim->dq;
        uVar5 = (ulong)TVar3 & 0xffffffff;
        pTVar2[uVar5].thief._M_b._M_p = self->_public;
        (*pTVar2[uVar5].f)(self,__dq_head,pTVar2 + uVar5);
        pTVar2[uVar5].thief._M_b._M_p = (__pointer_type)0x2;
        in_RAX = (Worker *)0x0;
      }
    }
    else if (victim->movesplit == '\0') {
      victim->movesplit = '\x01';
    }
    if (uVar4 < TVar1._4_4_) {
      return in_RAX;
    }
  }
  return (Worker *)0x2;
}

Assistant:

lace_steal(WorkerP *self, Task *__dq_head, Worker *victim)
{
    if (victim != NULL && !victim->allstolen) {
        TailSplitNA ts;
        ts.v = victim->ts.v;
        if (ts.ts.tail < ts.ts.split) {
            TailSplitNA ts_new;
            ts_new.v = ts.v;
            ts_new.ts.tail++;
            if (atomic_compare_exchange_weak(&victim->ts.v, &ts.v, ts_new.v)) {
                // Stolen
                Task *t = &victim->dq[ts.ts.tail];
                atomic_store_explicit(&t->thief, self->_public, memory_order_relaxed);
                lace_time_event(self, 1);
                t->f(self, __dq_head, t);
                lace_time_event(self, 2);
                atomic_store_explicit(&t->thief, THIEF_COMPLETED, memory_order_release);
                lace_time_event(self, 8);
                return LACE_STOLEN;
            }

            lace_time_event(self, 7);
            return LACE_BUSY;
        }

        if (victim->movesplit == 0) {
            victim->movesplit = 1;
            PR_COUNTSPLITS(self, CTR_split_req);
        }
    }

    lace_time_event(self, 7);
    return LACE_NOWORK;
}